

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitfield.h
# Opt level: O0

void __thiscall
ClownLZSS::Internal::BitField::
DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
::DescriptorFieldWriter
          (DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
           *this,CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_> *output)

{
  CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_> *output_local;
  DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
  *this_local;
  
  WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
  ::WriterBase(&this->
                super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
               ,output);
  std::fpos<__mbstate_t>::fpos(&this->descriptor_position);
  Begin(this);
  return;
}

Assistant:

DescriptorFieldWriter(Output &output)
					: Base::WriterBase(output)
				{
					Begin();
				}